

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void idx2::IncreaseCapacity<short,idx2::bitstream>(hash_table<short,_idx2::bitstream> *Ht)

{
  hash_table<short,_idx2::bitstream> *Ht_00;
  hash_table<short,_idx2::bitstream> *extraout_RDX;
  hash_table<short,_idx2::bitstream> *Ht_01;
  bitstream *in_R8;
  iterator local_b8;
  iterator local_98;
  undefined1 local_78 [8];
  iterator It;
  hash_table<short,_idx2::bitstream> NewHt;
  hash_table<short,_idx2::bitstream> *Ht_local;
  
  hash_table<short,_idx2::bitstream>::hash_table((hash_table<short,_idx2::bitstream> *)&It.Idx);
  Init<short,idx2::bitstream>
            ((hash_table<short,_idx2::bitstream> *)&It.Idx,Ht->LogCapacity + 1,Ht->Alloc);
  Begin<short,idx2::bitstream>((iterator *)local_78,(idx2 *)Ht,Ht_00);
  Ht_01 = extraout_RDX;
  while (End<short,idx2::bitstream>(&local_98,(idx2 *)Ht,Ht_01),
        (hash_table<short,_idx2::bitstream> *)It.Val != local_98.Ht ||
        It.Ht != (hash_table<short,_idx2::bitstream> *)local_98.Idx) {
    Insert<short,idx2::bitstream>
              (&local_b8,(idx2 *)&It.Idx,(hash_table<short,_idx2::bitstream> *)local_78,It.Key,in_R8
              );
    do {
      It.Ht = (hash_table<short,_idx2::bitstream> *)((long)&(It.Ht)->Keys + 1);
    } while (*(char *)((long)&(It.Ht)->Keys + (long)&(((It.Val)->Stream).Alloc)->_vptr_allocator) !=
             '\x02');
    local_78 = (undefined1  [8])(((It.Val)->Stream).Data + (long)It.Ht * 2);
    Ht_01 = (hash_table<short,_idx2::bitstream> *)((long)It.Ht * 0x30);
    It.Key = (short *)((long)&Ht_01->Keys + ((It.Val)->Stream).Bytes);
  }
  Dealloc<short,idx2::bitstream>(Ht);
  memcpy(Ht,&It.Idx,0x30);
  return;
}

Assistant:

void
IncreaseCapacity(hash_table<k, v>* Ht)
{
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
    Insert(&NewHt, *(It.Key), *(It.Val));
  Dealloc(Ht);
  *Ht = NewHt;
}